

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cc
# Opt level: O0

string * __thiscall
phosg::format_time_natural_abi_cxx11_(string *__return_storage_ptr__,phosg *this,timeval *tv)

{
  undefined1 local_68 [8];
  tm cooked;
  time_t sec;
  timeval local_tv;
  timeval *tv_local;
  
  local_tv.tv_usec = (__suseconds_t)this;
  if (this == (phosg *)0x0) {
    local_tv.tv_usec = (__suseconds_t)&sec;
    gettimeofday((timeval *)local_tv.tv_usec,(__timezone_ptr_t)0x0);
  }
  cooked.tm_zone = *(char **)local_tv.tv_usec;
  localtime_r((time_t *)&cooked.tm_zone,(tm *)local_68);
  string_printf_abi_cxx11_
            (__return_storage_ptr__,"%u %s %4u %02u:%02u:%02u.%03hu",(ulong)(uint)cooked.tm_min,
             format_time_natural::monthnames[cooked.tm_hour],(ulong)(cooked.tm_mday + 0x76c),
             (ulong)(uint)cooked.tm_sec,local_68._4_4_,local_68._0_4_,
             (uint)(*(long *)(local_tv.tv_usec + 8) / 1000) & 0xffff);
  return __return_storage_ptr__;
}

Assistant:

string format_time_natural(struct timeval* tv) {
  struct timeval local_tv;
  if (!tv) {
    tv = &local_tv;
    gettimeofday(tv, nullptr);
  }

  time_t sec = tv->tv_sec;
  struct tm cooked;
  localtime_r(&sec, &cooked);

  static const char* monthnames[] = {"January", "February", "March", "April",
      "May", "June", "July", "August", "September", "October", "November",
      "December"};

  return string_printf("%u %s %4u %02u:%02u:%02u.%03hu", cooked.tm_mday,
      monthnames[cooked.tm_mon], cooked.tm_year + 1900,
      cooked.tm_hour, cooked.tm_min, cooked.tm_sec,
      static_cast<uint16_t>(tv->tv_usec / 1000));
}